

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O3

void test_intersects(void)

{
  _Bool _Var1;
  bitset_t *bitset;
  bitset_t *bitset_00;
  bitset_t *pbVar2;
  int i;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  
  bitset = bitset_create();
  uVar3 = 0;
  bitset_00 = bitset_create();
  do {
    uVar4 = uVar3 >> 6;
    if ((uVar3 & 1) == 0) {
      bVar5 = 0x3e;
      pbVar2 = bitset;
      if (uVar4 < bitset->arraysize) goto LAB_0010240b;
      _Var1 = bitset_grow(bitset,uVar4 + 1);
      bVar5 = 0x3e;
LAB_00102407:
      if (_Var1 != false) goto LAB_0010240b;
    }
    else {
      bVar5 = 0x3f;
      pbVar2 = bitset_00;
      if (bitset_00->arraysize <= uVar4) {
        _Var1 = bitset_grow(bitset_00,uVar4 + 1);
        bVar5 = 0x3f;
        goto LAB_00102407;
      }
LAB_0010240b:
      pbVar2->array[uVar4] = pbVar2->array[uVar4] | 1L << (bVar5 & (byte)uVar3);
    }
    uVar3 = uVar3 + 1;
    if (uVar3 == 1000) {
      _Var1 = bitsets_intersect(bitset,bitset_00);
      _assert_true((ulong)!_Var1,"!bitsets_intersect(evens, odds)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cbitset_unit.c"
                   ,0xcb);
      if ((0xf < bitset->arraysize) || (_Var1 = bitset_grow(bitset,0x10), _Var1)) {
        bitset->array[0xf] = bitset->array[0xf] | 0x20000000000;
      }
      if ((0xf < bitset_00->arraysize) || (_Var1 = bitset_grow(bitset_00,0x10), _Var1)) {
        bitset_00->array[0xf] = bitset_00->array[0xf] | 0x20000000000;
      }
      _Var1 = bitsets_intersect(bitset,bitset_00);
      _assert_true((ulong)_Var1,"bitsets_intersect(evens, odds)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/cbitset_unit.c"
                   ,0xd0);
      bitset_free(bitset);
      bitset_free(bitset_00);
      return;
    }
  } while( true );
}

Assistant:

void test_intersects() {
    bitset_t *evens = bitset_create();
    bitset_t *odds = bitset_create();

    for (int i = 0; i < 1000; i++) {
        if (i % 2 == 0)
            bitset_set(evens, i);
        else
            bitset_set(odds, i);
    }

    assert_true(!bitsets_intersect(evens, odds));

    bitset_set(evens, 1001);
    bitset_set(odds, 1001);

    assert_true(bitsets_intersect(evens, odds));

    bitset_free(evens);
    bitset_free(odds);
}